

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O1

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> __thiscall
anon_unknown.dwarf_25a9c::create_dic(anon_unknown_dwarf_25a9c *this,string *dic_type)

{
  int iVar1;
  undefined8 in_RAX;
  DictionaryMLT<false,_false> *this_00;
  
  iVar1 = std::__cxx11::string::compare((char *)dic_type);
  if (iVar1 == 0) {
    this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
    ddd::DictionarySGL<false,_false>::DictionarySGL((DictionarySGL<false,_false> *)this_00);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)dic_type);
    if (iVar1 == 0) {
      this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
      ddd::DictionarySGL<false,_true>::DictionarySGL((DictionarySGL<false,_true> *)this_00);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)dic_type);
      if (iVar1 == 0) {
        this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
        ddd::DictionarySGL<true,_false>::DictionarySGL((DictionarySGL<true,_false> *)this_00);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)dic_type);
        if (iVar1 == 0) {
          this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
          ddd::DictionarySGL<true,_true>::DictionarySGL((DictionarySGL<true,_true> *)this_00);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)dic_type);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)dic_type);
            if (iVar1 == 0) {
              ddd::make_unique<ddd::DictionaryMLT<false,true>>();
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)dic_type);
              if (iVar1 == 0) {
                ddd::make_unique<ddd::DictionaryMLT<true,false>>();
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)dic_type);
                if (iVar1 != 0) {
                  *(undefined8 *)this = 0;
                  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                          )(__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                            )this;
                }
                ddd::make_unique<ddd::DictionaryMLT<true,true>>();
              }
            }
            *(undefined8 *)this = in_RAX;
            return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                    )(__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                      )this;
          }
          this_00 = (DictionaryMLT<false,_false> *)operator_new(0x38);
          ddd::DictionaryMLT<false,_false>::DictionaryMLT(this_00);
        }
      }
    }
  }
  *(DictionaryMLT<false,_false> **)this = this_00;
  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)
         (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Dictionary> create_dic(const std::string dic_type) {
  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>();
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>();
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>();
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>();
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>();
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>();
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>();
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>();
  }
  return nullptr;
}